

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

void mpack_tree_init_stdfile
               (mpack_tree_t *tree,FILE *stdfile,size_t max_bytes,_Bool close_when_done)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long *__ptr;
  int *piVar4;
  size_t __size;
  void *pvVar5;
  size_t sVar6;
  mpack_error_t mVar7;
  long lVar8;
  
  if ((long)max_bytes < 0) {
    memset(tree,0,0xa0);
    (tree->nil_node).type = mpack_type_nil;
    *(undefined4 *)&tree->max_size = 0xffffffff;
    *(undefined4 *)((long)&tree->max_size + 4) = 0xffffffff;
    *(undefined4 *)&tree->max_nodes = 0xffffffff;
    *(undefined4 *)((long)&tree->max_nodes + 4) = 0xffffffff;
    tree->error = mpack_error_bug;
    return;
  }
  __ptr = (long *)malloc(0x1010);
  if (__ptr == (long *)0x0) {
    memset(tree,0,0xa0);
    (tree->nil_node).type = mpack_type_nil;
    *(undefined4 *)&tree->max_size = 0xffffffff;
    *(undefined4 *)((long)&tree->max_size + 4) = 0xffffffff;
    *(undefined4 *)&tree->max_nodes = 0xffffffff;
    *(undefined4 *)((long)&tree->max_nodes + 4) = 0xffffffff;
    tree->error = mpack_error_memory;
  }
  else {
    piVar4 = __errno_location();
    *piVar4 = 0;
    fseek((FILE *)stdfile,0,2);
    iVar1 = *piVar4;
    __size = ftell((FILE *)stdfile);
    iVar2 = *piVar4;
    fseek((FILE *)stdfile,0,0);
    if ((long)__size < 0) {
      mVar7 = mpack_error_io;
    }
    else {
      mVar7 = mpack_error_io;
      if ((iVar1 == 0 && iVar2 == 0) && *piVar4 == 0) {
        if (__size == 0) {
          mVar7 = mpack_error_invalid;
        }
        else {
          mVar7 = mpack_error_too_big;
          if (max_bytes == 0 || __size <= max_bytes) {
            pvVar5 = malloc(__size);
            *__ptr = (long)pvVar5;
            if (pvVar5 != (void *)0x0) {
              for (lVar8 = 0; __size - lVar8 != 0 && lVar8 <= (long)__size; lVar8 = lVar8 + sVar6) {
                sVar6 = fread((void *)(*__ptr + lVar8),1,__size - lVar8,(FILE *)stdfile);
                if (sVar6 == 0) {
                  memset(tree,0,0xa0);
                  (tree->nil_node).type = mpack_type_nil;
                  *(undefined4 *)&tree->max_size = 0xffffffff;
                  *(undefined4 *)((long)&tree->max_size + 4) = 0xffffffff;
                  *(undefined4 *)&tree->max_nodes = 0xffffffff;
                  *(undefined4 *)((long)&tree->max_nodes + 4) = 0xffffffff;
                  tree->error = mpack_error_io;
                  free((void *)*__ptr);
                  goto LAB_001099a1;
                }
              }
              __ptr[1] = __size;
              pcVar3 = (char *)*__ptr;
              memset(tree,0,0xa0);
              (tree->nil_node).type = mpack_type_nil;
              *(undefined4 *)&tree->max_size = 0xffffffff;
              *(undefined4 *)((long)&tree->max_size + 4) = 0xffffffff;
              *(undefined4 *)&tree->max_nodes = 0xffffffff;
              *(undefined4 *)((long)&tree->max_nodes + 4) = 0xffffffff;
              tree->data = pcVar3;
              tree->data_length = __size;
              tree->pool = (mpack_node_data_t *)0x0;
              tree->pool_count = 0;
              tree->next = (mpack_tree_page_t *)0x0;
              tree->context = __ptr;
              tree->teardown = mpack_file_tree_teardown;
              goto LAB_001099ad;
            }
            mVar7 = mpack_error_memory;
          }
        }
      }
    }
    memset(tree,0,0xa0);
    (tree->nil_node).type = mpack_type_nil;
    *(undefined4 *)&tree->max_size = 0xffffffff;
    *(undefined4 *)((long)&tree->max_size + 4) = 0xffffffff;
    *(undefined4 *)&tree->max_nodes = 0xffffffff;
    *(undefined4 *)((long)&tree->max_nodes + 4) = 0xffffffff;
    tree->error = mVar7;
LAB_001099a1:
    free(__ptr);
  }
LAB_001099ad:
  if (!close_when_done) {
    return;
  }
  fclose((FILE *)stdfile);
  return;
}

Assistant:

void mpack_tree_init_stdfile(mpack_tree_t* tree, FILE* stdfile, size_t max_bytes, bool close_when_done) {
    if (!mpack_tree_file_check_max_bytes(tree, max_bytes))
        return;

    mpack_tree_init_stdfile_noclose(tree, stdfile, max_bytes);

    if (close_when_done)
        fclose(stdfile);
}